

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GaussianVariableElimination.cpp
# Opt level: O1

Result __thiscall
Inferences::GaussianVariableElimination::rewrite
          (GaussianVariableElimination *this,Clause *cl,TermList find,TermList replace,
          uint skipLiteral,bool doCheckOrdering)

{
  Literal *lit;
  Stack<Kernel::Literal_*> *this_00;
  uint uVar1;
  undefined8 extraout_RAX;
  undefined7 uVar3;
  Literal *pLVar2;
  ulong uVar4;
  Result RVar5;
  RStack<Literal_*> resLits;
  Inference inf;
  uint local_c0;
  SimplifyingInference1 local_b8;
  TermList local_a8;
  TermList local_a0;
  Inference local_98;
  Inference local_68;
  
  *(int *)(DAT_00b7e1c0 + 0x184) = *(int *)(DAT_00b7e1c0 + 0x184) + 1;
  local_b8.rule = GAUSSIAN_VARIABLE_ELIMINIATION;
  local_b8.premise = cl;
  local_a8._content = find._content;
  local_a0._content = replace._content;
  Kernel::Inference::Inference(&local_98,&local_b8);
  ::Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
           &local_b8);
  uVar3 = (undefined7)((ulong)extraout_RAX >> 8);
  if ((*(uint *)&cl->field_0x38 & 0xfffff) == 0) {
    local_c0 = (uint)CONCAT71(uVar3,1);
  }
  else {
    local_c0 = (uint)CONCAT71(uVar3,1);
    uVar4 = 0;
    do {
      if (skipLiteral != uVar4) {
        this_00 = (Stack<Kernel::Literal_*> *)CONCAT71(local_b8._1_7_,local_b8.rule);
        lit = cl->_literals[uVar4];
        pLVar2 = Kernel::EqHelper::replace(lit,local_a8,local_a0);
        uVar1 = local_c0 & 0xff;
        local_c0 = uVar1;
        if (doCheckOrdering) {
          local_c0 = 0;
        }
        if (pLVar2 == lit) {
          local_c0 = uVar1;
        }
        if (this_00->_cursor == this_00->_end) {
          ::Lib::Stack<Kernel::Literal_*>::expand(this_00);
        }
        *this_00->_cursor = pLVar2;
        this_00->_cursor = this_00->_cursor + 1;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < ((uint)*(undefined8 *)&cl->field_0x38 & 0xfffff));
  }
  if ((local_c0 & 1) == 0) {
    *(int *)(DAT_00b7e1c0 + 0x180) = *(int *)(DAT_00b7e1c0 + 0x180) + 1;
  }
  local_68._0_8_ = local_98._0_8_;
  local_68._8_4_ = local_98._8_4_;
  local_68._age = local_98._age;
  local_68._splits = local_98._splits;
  local_68._ptr1 = local_98._ptr1;
  local_68._ptr2 = local_98._ptr2;
  local_68.th_ancestors = local_98.th_ancestors;
  local_68.all_ancestors = local_98.all_ancestors;
  RVar5.simplified =
       Kernel::Clause::fromStack
                 ((Stack<Kernel::Literal_*> *)CONCAT71(local_b8._1_7_,local_b8.rule),&local_68);
  ::Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
            &local_b8);
  RVar5._8_4_ = local_c0;
  RVar5._12_4_ = 0;
  return RVar5;
}

Assistant:

SimplifyingGeneratingInference1::Result GaussianVariableElimination::rewrite(Clause& cl, TermList find, TermList replace, unsigned skipLiteral, bool doCheckOrdering) const 
{
  env.statistics->gveCnt++;

  Inference inf(SimplifyingInference1(Kernel::InferenceRule::GAUSSIAN_VARIABLE_ELIMINIATION, &cl));

  bool premiseRedundant = true;

  auto checkLeq = [&](Literal* orig, Literal* rewritten) 
  { 
    if (doCheckOrdering) {
      if (rewritten != orig) {
        // as soon as we rewrite some clause x /= t \/ C[x] into C[t], the result will be incomparable
        // since the weight of t will be at least as big as the weight of x, hence we C[t] won't be smaller 
        // than C[x]
        premiseRedundant = false;
      }
    }
    return rewritten;
  };

  RStack<Literal*> resLits;
  for (unsigned i = 0; i < cl.size(); i++) {
    if (i != skipLiteral) {
      resLits->push(checkLeq(cl[i], EqHelper::replace(cl[i], find, replace)));
    }
  }

  if(!premiseRedundant) {
    env.statistics->gveViolations++;
  }

  return SimplifyingGeneratingInference1::Result{Clause::fromStack(*resLits, inf), premiseRedundant};
}